

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O2

void __thiscall crnlib::mipmapped_texture::assign(mipmapped_texture *this,mip_level *pLevel)

{
  face_vec faces;
  vector<crnlib::mip_level_*> local_30;
  mip_level *pLevel_local;
  
  pLevel_local = pLevel;
  vector<crnlib::mip_level_*>::vector(&local_30,1,&pLevel_local);
  vector<crnlib::vector<crnlib::mip_level_*>_>::vector(&faces,1,&local_30);
  vector<crnlib::mip_level_*>::~vector(&local_30);
  assign(this,&faces);
  vector<crnlib::vector<crnlib::mip_level_*>_>::~vector(&faces);
  return;
}

Assistant:

void mipmapped_texture::assign(mip_level* pLevel) {
  face_vec faces(1, mip_ptr_vec(1, pLevel));
  assign(faces);
}